

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

bool tcu::fuzzyCompare(TestLog *log,char *imageSetName,char *imageSetDesc,Surface *reference,
                      Surface *result,float threshold,CompareLogMode logMode)

{
  bool bVar1;
  ConstPixelBufferAccess local_88;
  ConstPixelBufferAccess local_60;
  CompareLogMode local_38;
  float local_34;
  CompareLogMode logMode_local;
  float threshold_local;
  Surface *result_local;
  Surface *reference_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  
  local_38 = logMode;
  local_34 = threshold;
  _logMode_local = result;
  result_local = reference;
  reference_local = (Surface *)imageSetDesc;
  imageSetDesc_local = imageSetName;
  imageSetName_local = (char *)log;
  Surface::getAccess(&local_60,reference);
  Surface::getAccess(&local_88,_logMode_local);
  bVar1 = fuzzyCompare(log,imageSetName,imageSetDesc,&local_60,&local_88,local_34,local_38);
  return bVar1;
}

Assistant:

bool fuzzyCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const Surface& reference, const Surface& result, float threshold, CompareLogMode logMode)
{
	return fuzzyCompare(log, imageSetName, imageSetDesc, reference.getAccess(), result.getAccess(), threshold, logMode);
}